

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

Atom * __thiscall
OpenMD::MoleculeCreator::createAtom
          (MoleculeCreator *this,ForceField *ff,AtomStamp *stamp,LocalIndexManager *localIndexMan)

{
  bool bVar1;
  int index;
  AtomType *at;
  undefined8 uVar2;
  AtomType *this_00;
  Atom *pAVar3;
  AtomStamp *in_RDX;
  ForceField *in_RSI;
  ForceField *pFVar4;
  DirectionalAtom *dAtom;
  RealType charge;
  FixedChargeAdapter fca;
  int ident;
  AtomType *atomTypeOverride;
  AtomType *atB;
  string atomTypeOverrideName;
  ostringstream ss;
  RealType oc;
  string baseType;
  Atom *atom;
  AtomType *atomType;
  AtomStamp *in_stack_fffffffffffffce8;
  AtomType *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffd10;
  AtomType *in_stack_fffffffffffffd18;
  AtomType *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd28;
  ForceField *in_stack_fffffffffffffd30;
  AtomType *atomType_00;
  ForceField *in_stack_fffffffffffffd50;
  FixedChargeAdapter in_stack_fffffffffffffd60;
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  ostringstream local_220 [88];
  AtomType *in_stack_fffffffffffffe38;
  DirectionalAtom *in_stack_fffffffffffffe40;
  string local_a0 [32];
  string local_80 [48];
  undefined1 local_50 [64];
  ForceField *local_10;
  
  atomType_00 = (AtomType *)local_50;
  local_50._56_8_ = in_RDX;
  local_10 = in_RSI;
  AtomStamp::getType_abi_cxx11_(in_stack_fffffffffffffce8);
  at = ForceField::getAtomType(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_50._40_8_ = at;
  std::__cxx11::string::~string((string *)local_50);
  if ((AtomType *)local_50._40_8_ == (AtomType *)0x0) {
    AtomStamp::getType_abi_cxx11_(in_stack_fffffffffffffce8);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"Can not find Matching Atom Type for[%s]",uVar2);
    std::__cxx11::string::~string(local_80);
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = AtomStamp::hasOverride((AtomStamp *)local_50._56_8_);
  if (bVar1) {
    AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffce8);
    pFVar4 = (ForceField *)AtomStamp::getOverrideCharge((AtomStamp *)local_50._56_8_);
    in_stack_fffffffffffffd30 = pFVar4;
    std::__cxx11::ostringstream::ostringstream(local_220);
    std::ostream::operator<<(local_220,(double)pFVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::__cxx11::ostringstream::str();
    std::operator+(in_stack_fffffffffffffd28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd20);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_260);
    this_00 = ForceField::getAtomType(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    if (this_00 == (AtomType *)0x0) {
      this_00 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(in_stack_fffffffffffffd60.at_);
      in_stack_fffffffffffffd20 = this_00;
      (*this_00->_vptr_AtomType[2])(this_00,local_50._40_8_);
      in_stack_fffffffffffffd18 = (AtomType *)ForceField::getNAtomType((ForceField *)0x1ead45);
      AtomType::setIdent(this_00,(int)in_stack_fffffffffffffd18);
      AtomType::setName(in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8);
      ForceField::addAtomType(in_stack_fffffffffffffd50,(string *)at,atomType_00);
      FixedChargeAdapter::FixedChargeAdapter((FixedChargeAdapter *)&stack0xfffffffffffffd60,this_00)
      ;
      ForceField::getForceFieldOptions(local_10);
      ForceFieldOptions::getChargeUnitScaling((ForceFieldOptions *)0x1eadd6);
      FixedChargeAdapter::makeFixedCharge((FixedChargeAdapter *)atomType_00,(RealType)in_RSI);
    }
    local_50._40_8_ = this_00;
    std::__cxx11::string::~string(local_240);
    std::__cxx11::ostringstream::~ostringstream(local_220);
    std::__cxx11::string::~string(local_a0);
  }
  bVar1 = AtomType::isDirectional((AtomType *)in_stack_fffffffffffffd30);
  if (bVar1) {
    pAVar3 = (Atom *)operator_new(0x130);
    DirectionalAtom::DirectionalAtom(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_50._32_8_ = pAVar3;
  }
  else {
    pAVar3 = (Atom *)operator_new(0x88);
    Atom::Atom((Atom *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_50._32_8_ = pAVar3;
  }
  pAVar3 = (Atom *)local_50._32_8_;
  index = LocalIndexManager::getNextAtomIndex((LocalIndexManager *)0x1eb026);
  StuntDouble::setLocalIndex(&pAVar3->super_StuntDouble,index);
  return (Atom *)local_50._32_8_;
}

Assistant:

Atom* MoleculeCreator::createAtom(ForceField* ff, AtomStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    AtomType* atomType;
    Atom* atom;

    atomType = ff->getAtomType(stamp->getType());
    if (atomType == NULL) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Can not find Matching Atom Type for[%s]",
               stamp->getType().c_str());

      painCave.isFatal = 1;
      simError();
    }

    if (stamp->hasOverride()) {
      std::string baseType = atomType->getName();
      RealType oc          = stamp->getOverrideCharge();

      // Create a new atom type name that builds in the override charge:
      std::ostringstream ss;
      ss << oc;
      std::string atomTypeOverrideName = baseType + "_q=" + ss.str();

      // Maybe we've seen this before?

      AtomType* atB = ff->getAtomType(atomTypeOverrideName);

      if (atB == NULL) {
        // Nope, we've never seen it before, so make a new one:
        AtomType* atomTypeOverride = new AtomType();
        // Base points to the atomType we already found
        atomTypeOverride->useBase(atomType);
        int ident = ff->getNAtomType();
        atomTypeOverride->setIdent(ident);
        atomTypeOverride->setName(atomTypeOverrideName);
        ff->addAtomType(atomTypeOverrideName, atomTypeOverride);
        FixedChargeAdapter fca = FixedChargeAdapter(atomTypeOverride);
        RealType charge =
            ff->getForceFieldOptions().getChargeUnitScaling() * oc;
        fca.makeFixedCharge(charge);
        // officially use override type for this atom
	atomType = atomTypeOverride;
      } else {
        // we've previously created the override type for this atom, so use that
        // one:
        atomType = atB;
      }
    }

    // below code still have some kind of hard-coding smell
    if (atomType->isDirectional()) {
      DirectionalAtom* dAtom;
      dAtom = new DirectionalAtom(atomType);
      atom  = dAtom;
    } else {
      atom = new Atom(atomType);
    }

    atom->setLocalIndex(localIndexMan->getNextAtomIndex());

    return atom;
  }